

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# if.h
# Opt level: O2

char * If_CutDsdPerm(If_Man_t *p,If_Cut_t *pCut)

{
  Vec_Str_t *pVVar1;
  int iVar2;
  uint uVar3;
  
  pVVar1 = p->vTtPerms[(byte)pCut->field_0x1f];
  iVar2 = Abc_Lit2Var(pCut->iCutFunc);
  uVar3 = 6;
  if (6 < (byte)pCut->field_0x1f) {
    uVar3 = (uint)(byte)pCut->field_0x1f;
  }
  if ((int)(uVar3 * iVar2) < pVVar1->nSize) {
    return pVVar1->pArray + uVar3 * iVar2;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                ,0x175,"char *Vec_StrEntryP(Vec_Str_t *, int)");
}

Assistant:

static inline char *     If_CutDsdPerm( If_Man_t * p, If_Cut_t * pCut )      { return Vec_StrEntryP( p->vTtPerms[pCut->nLeaves], Abc_Lit2Var(pCut->iCutFunc) * Abc_MaxInt(6, pCut->nLeaves) );           }